

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

DeviceInfo * __thiscall
RtApi::getDeviceInfo(DeviceInfo *__return_storage_ptr__,RtApi *this,uint deviceId)

{
  uint uVar1;
  pointer pcVar2;
  RtAudioFormat RVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  pointer pDVar8;
  bool bVar9;
  bool bVar10;
  
  if ((this->deviceList_).
      super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->deviceList_).
      super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
      super__Vector_impl_data._M_start) {
    (*this->_vptr_RtApi[0xb])(this);
  }
  pDVar8 = (this->deviceList_).
           super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(this->deviceList_).
                super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pDVar8;
  bVar9 = lVar6 != 0;
  if (bVar9) {
    uVar1 = pDVar8->ID;
    if (uVar1 != deviceId) {
      uVar4 = (lVar6 >> 5) * -0x5555555555555555;
      uVar5 = 1;
      do {
        uVar7 = (ulong)uVar5;
        bVar10 = uVar4 - uVar7 == 0;
        bVar9 = uVar4 >= uVar7 && !bVar10;
        if (uVar4 < uVar7 || bVar10) goto LAB_0010b20c;
        uVar1 = pDVar8[uVar7].ID;
        uVar5 = uVar5 + 1;
      } while (uVar1 != deviceId);
      pDVar8 = pDVar8 + uVar7;
    }
    __return_storage_ptr__->ID = uVar1;
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    pcVar2 = (pDVar8->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->name,pcVar2,
               pcVar2 + (pDVar8->name)._M_string_length);
    uVar1 = pDVar8->outputChannels;
    uVar5 = pDVar8->inputChannels;
    *(undefined8 *)((long)&__return_storage_ptr__->inputChannels + 2) =
         *(undefined8 *)((long)&pDVar8->inputChannels + 2);
    __return_storage_ptr__->outputChannels = uVar1;
    __return_storage_ptr__->inputChannels = uVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&__return_storage_ptr__->sampleRates,&pDVar8->sampleRates);
    uVar1 = pDVar8->preferredSampleRate;
    RVar3 = pDVar8->nativeFormats;
    __return_storage_ptr__->currentSampleRate = pDVar8->currentSampleRate;
    __return_storage_ptr__->preferredSampleRate = uVar1;
    __return_storage_ptr__->nativeFormats = RVar3;
    if (bVar9) {
      return __return_storage_ptr__;
    }
  }
LAB_0010b20c:
  std::__cxx11::string::_M_replace
            ((ulong)&this->errorText_,0,(char *)(this->errorText_)._M_string_length,0x115564);
  error(this,RTAUDIO_INVALID_PARAMETER);
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->name).field_2 + 8) = 0;
  __return_storage_ptr__->outputChannels = 0;
  __return_storage_ptr__->inputChannels = 0;
  __return_storage_ptr__->duplexChannels = 0;
  __return_storage_ptr__->isDefaultOutput = false;
  __return_storage_ptr__->isDefaultInput = false;
  *(undefined2 *)&__return_storage_ptr__->field_0x36 = 0;
  (__return_storage_ptr__->sampleRates).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->sampleRates).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->sampleRates).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->currentSampleRate = 0;
  __return_storage_ptr__->preferredSampleRate = 0;
  __return_storage_ptr__->nativeFormats = 0;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->outputChannels = 0;
  __return_storage_ptr__->inputChannels = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->inputChannels + 2) = 0;
  (__return_storage_ptr__->sampleRates).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->sampleRates).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->sampleRates).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->currentSampleRate = 0;
  __return_storage_ptr__->preferredSampleRate = 0;
  __return_storage_ptr__->nativeFormats = 0;
  return __return_storage_ptr__;
}

Assistant:

RtAudio::DeviceInfo RtApi :: getDeviceInfo( unsigned int deviceId )
{
  if ( deviceList_.size() == 0 ) probeDevices();
  for ( unsigned int m=0; m<deviceList_.size(); m++ ) {
    if ( deviceList_[m].ID == deviceId )
      return deviceList_[m];
  }

  errorText_ = "RtApi::getDeviceInfo: deviceId argument not found.";
  error( RTAUDIO_INVALID_PARAMETER );
  return RtAudio::DeviceInfo();
}